

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMS_CONTEXT_Unmarshal(TPMS_CONTEXT *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT64_Unmarshal(&target->sequence,buffer,size);
  if (TVar1 == 0) {
    TVar1 = TPMI_DH_CONTEXT_Unmarshal(&target->savedHandle,buffer,size);
    if (TVar1 == 0) {
      TVar1 = TPMI_RH_HIERARCHY_Unmarshal(&target->hierarchy,buffer,size,1);
      if (TVar1 == 0) {
        TVar1 = TPM2B_CONTEXT_DATA_Unmarshal(&target->contextBlob,buffer,size);
        return TVar1;
      }
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMS_CONTEXT_Unmarshal(TPMS_CONTEXT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->sequence), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_DH_CONTEXT_Unmarshal((TPMI_DH_CONTEXT *)&(target->savedHandle), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_RH_HIERARCHY_Unmarshal((TPMI_RH_HIERARCHY *)&(target->hierarchy), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_CONTEXT_DATA_Unmarshal((TPM2B_CONTEXT_DATA *)&(target->contextBlob), buffer, size);
    return result;
}